

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O0

int Cec_ManPatComputePattern_rec(Cec_ManSat_t *pSat,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Gia_Obj_t *pGVar7;
  int Counter;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Cec_ManSat_t *pSat_local;
  
  iVar3 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar3 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar3 = Gia_ObjIsCi(pObj);
    if (iVar3 == 0) {
      iVar3 = Gia_ObjIsAnd(pObj);
      if (iVar3 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                      ,0x97,
                      "int Cec_ManPatComputePattern_rec(Cec_ManSat_t *, Gia_Man_t *, Gia_Obj_t *)");
      }
      pGVar7 = Gia_ObjFanin0(pObj);
      iVar3 = Cec_ManPatComputePattern_rec(pSat,p,pGVar7);
      pGVar7 = Gia_ObjFanin1(pObj);
      iVar5 = Cec_ManPatComputePattern_rec(pSat,p,pGVar7);
      pSat_local._4_4_ = iVar5 + iVar3;
      pGVar7 = Gia_ObjFanin0(pObj);
      uVar1 = *(undefined8 *)pGVar7;
      uVar4 = Gia_ObjFaninC0(pObj);
      pGVar7 = Gia_ObjFanin1(pObj);
      uVar2 = *(undefined8 *)pGVar7;
      uVar6 = Gia_ObjFaninC1(pObj);
      *(ulong *)pObj =
           *(ulong *)pObj & 0xbfffffffffffffff |
           ((ulong)(((uint)((ulong)uVar1 >> 0x3e) & 1 ^ uVar4) &
                   ((uint)((ulong)uVar2 >> 0x3e) & 1 ^ uVar6)) & 1) << 0x3e;
    }
    else {
      uVar4 = Cec_ObjSatVarValue(pSat,pObj);
      *(ulong *)pObj = *(ulong *)pObj & 0xbfffffffffffffff | ((ulong)uVar4 & 1) << 0x3e;
      pSat_local._4_4_ = 1;
    }
  }
  else {
    pSat_local._4_4_ = 0;
  }
  return pSat_local._4_4_;
}

Assistant:

int Cec_ManPatComputePattern_rec( Cec_ManSat_t * pSat, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int Counter = 0;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        pObj->fMark1 = Cec_ObjSatVarValue( pSat, pObj );
        return 1;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Counter += Cec_ManPatComputePattern_rec( pSat, p, Gia_ObjFanin0(pObj) );
    Counter += Cec_ManPatComputePattern_rec( pSat, p, Gia_ObjFanin1(pObj) );
    pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) & 
                   (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj));
    return Counter;
}